

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>::ResetSubElements
          (TPZGeoElRefPattern<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_> *this)

{
  TPZReference *pTVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  
  iVar2 = (**(code **)(*(long *)&(this->
                                 super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>
                                 ).super_TPZGeoEl + 0x148))();
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      plVar3 = (long *)(**(code **)(*(long *)&(this->
                                              super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>
                                              ).super_TPZGeoEl + 0x1f8))(this);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x1f0))(plVar3);
      }
      (this->fSubEl).fStore[lVar4] = -1;
      lVar4 = lVar4 + 1;
      iVar2 = (**(code **)(*(long *)&(this->
                                     super_TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTetrahedra>_>
                                     ).super_TPZGeoEl + 0x148))(this);
    } while (lVar4 < iVar2);
  }
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0)) {
    TPZAutoPointer<TPZRefPattern>::operator=(&this->fRefPattern,(TPZRefPattern *)0x0);
    return;
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::ResetSubElements()
{
	int is;
	for (is=0;is<NSubElements();is++)
	{
        TPZGeoEl *gel = SubElement(is);
        if (gel) {
            int64_t noFather = -1;
            gel->SetFatherIndex(noFather);
        }
		fSubEl[is] = -1;
	}
    /*  Delete and reset the fRefPattern.
        Once the sons are removed, fRefPattern could be also deleted.
        The user can keep the fRefPattern using Get and Set methods.*/
    if(this->fRefPattern) this->fRefPattern=NULL;
}